

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

string * __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
::to_string_abi_cxx11_(string *__return_storage_ptr__,void *this,int level)

{
  long *plVar1;
  char cVar2;
  assertion_error *this_00;
  jsonpath_token_kind kind;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sbuf;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar2 = (char)level;
  switch(*this) {
  case 0:
    if (0 < level) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((ulong)__return_storage_ptr__,cVar2 * '\x02');
    }
    goto LAB_00311488;
  case 1:
    if (0 < level) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((ulong)__return_storage_ptr__,cVar2 * '\x02');
    }
    goto LAB_00311488;
  case 2:
    (**(code **)(**(long **)((long)this + 8) + 0x18))(&sbuf,*(long **)((long)this + 8),level);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  default:
    if (0 < level) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((ulong)__return_storage_ptr__,cVar2 * '\x02');
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    detail::to_string_abi_cxx11_(&sbuf,(detail *)(ulong)*this,kind);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case 0xd:
    if (0 < level) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((ulong)__return_storage_ptr__,cVar2 * '\x02');
    }
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::to_string_abi_cxx11_
              (&sbuf,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                     ((long)this + 8));
    unicode_traits::convert<char,std::__cxx11::string>
              (sbuf._M_dataplus._M_p,sbuf._M_string_length,__return_storage_ptr__,strict);
    break;
  case 0xe:
    plVar1 = *(long **)((long)this + 8);
    if (plVar1 == (long *)0x0) {
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sbuf,"assertion \'selector_ != nullptr\' failed at  <> :0",&local_39);
      assertion_error::assertion_error(this_00,&sbuf);
      __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    (**(code **)(*plVar1 + 0x28))(&sbuf,plVar1,level);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case 0xf:
    (**(code **)(**(long **)((long)this + 8) + 0x18))(&sbuf,*(long **)((long)this + 8),level);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case 0x11:
    if (0 < level) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((ulong)__return_storage_ptr__,cVar2 * '\x02');
    }
LAB_00311488:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  case 0x13:
    (**(code **)(**(long **)((long)this + 8) + 0x18))(&sbuf,*(long **)((long)this + 8),level);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&sbuf);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(int level) const
        {
            std::string s;
            switch (token_kind_)
            {
                case jsonpath_token_kind::root_node:
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    s.append("root node");
                    break;
                case jsonpath_token_kind::current_node:
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    s.append("current node");
                    break;
                case jsonpath_token_kind::argument:
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    s.append("argument");
                    break;
                case jsonpath_token_kind::selector:
                    JSONCONS_ASSERT(selector_ != nullptr);
                    s.append(selector_->to_string(level));
                    break;
                case jsonpath_token_kind::expression:
                    s.append(expression_->to_string(level));
                    break;
                case jsonpath_token_kind::literal:
                {
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    auto sbuf = value_.to_string();
                    unicode_traits::convert(sbuf.data(), sbuf.size(), s);
                    break;
                }
                case jsonpath_token_kind::binary_operator:
                    s.append(binary_operator_->to_string(level));
                    break;
                case jsonpath_token_kind::function:
                    s.append(function_->to_string(level));
                    break;
                default:
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    s.append("token kind: ");
                    s.append(jsoncons::jsonpath::detail::to_string(token_kind_));
                    break;
            }
            //s.append("\n");
            return s;
        }